

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesInstance::verifyImage
          (TestStatus *__return_storage_ptr__,RasterizationSamplesInstance *this,
          ConstPixelBufferAccess *result)

{
  deUint32 *this_00;
  TestLog *log;
  bool bVar1;
  deUint32 dVar2;
  PrimitiveType primitive;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  ConstPixelBufferAccess *result_00;
  allocator<char> local_5b9;
  ConstPixelBufferAccess *local_5b8;
  TextureFormat tcuColorFormat;
  TextureFormat tcuDepthFormat;
  ColorVertexShader vertexShader;
  ColorFragmentShader fragmentShader;
  ReferenceRenderer refRenderer;
  Program program;
  VkPhysicalDeviceProperties deviceProperties;
  RenderState renderState;
  
  dVar2 = getUniqueColorsCount(result);
  deviceProperties._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = &deviceProperties.vendorID;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"\nMin. unique colors expected: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Unique colors found: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&deviceProperties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  if (dVar2 < 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&deviceProperties,"Unique colors out of expected bounds",
               (allocator<char> *)&renderState);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&deviceProperties);
  }
  else {
    local_5b8 = result;
    tcuColorFormat = ::vk::mapVkFormat(this->m_colorFormat);
    tcuDepthFormat.order = CHANNELORDER_LAST;
    tcuDepthFormat.type = CHANNELTYPE_LAST;
    ColorVertexShader::ColorVertexShader((ColorVertexShader *)&vertexShader.super_VertexShader);
    ColorFragmentShader::ColorFragmentShader(&fragmentShader,&tcuColorFormat,&tcuDepthFormat);
    program.geometryShader = (GeometryShader *)0x0;
    program.vertexShader = &vertexShader.super_VertexShader;
    program.fragmentShader = &fragmentShader.super_FragmentShader;
    ReferenceRenderer::ReferenceRenderer
              (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
               &tcuColorFormat,&tcuDepthFormat,&program);
    ReferenceRenderer::getViewportState(&refRenderer);
    result_00 = local_5b8;
    rr::RenderState::RenderState
              (&renderState,(ViewportState *)&deviceProperties,VIEWPORTORIENTATION_LOWER_LEFT);
    if (this->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
      pIVar3 = Context::getInstanceInterface((this->super_TestInstance).m_context);
      pVVar4 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
      (*pIVar3->_vptr_InstanceInterface[5])(pIVar3,pVVar4,&deviceProperties);
      renderState.point.pointSize = 3.0;
      if (deviceProperties.limits.pointSizeRange[1] <= 3.0) {
        renderState.point.pointSize = deviceProperties.limits.pointSizeRange[1];
      }
    }
    if (this->m_modeFlags == 0) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&deviceProperties,0.0);
      ReferenceRenderer::colorClear(&refRenderer,(Vec4 *)&deviceProperties);
      result_00 = local_5b8;
    }
    else {
      deviceProperties.apiVersion = 0x3f800000;
      deviceProperties.driverVersion = 0;
      deviceProperties.vendorID = 0;
      deviceProperties.deviceID = 0x3f800000;
      ReferenceRenderer::colorClear(&refRenderer,(Vec4 *)&deviceProperties);
    }
    primitive = mapVkPrimitiveTopology(this->m_primitiveTopology);
    ReferenceRenderer::draw(&refRenderer,&renderState,primitive,&this->m_vertices);
    log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    ReferenceRenderer::getAccess((PixelBufferAccess *)&deviceProperties,&refRenderer);
    bVar1 = tcu::fuzzyCompare(log,"FuzzyImageCompare","Image comparison",
                              (ConstPixelBufferAccess *)&deviceProperties,result_00,0.05,
                              COMPARE_LOG_RESULT);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&deviceProperties,"Primitive has unexpected shape",&local_5b9);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&deviceProperties);
      std::__cxx11::string::~string((string *)&deviceProperties);
      ReferenceRenderer::~ReferenceRenderer(&refRenderer);
      rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
      rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
      return __return_storage_ptr__;
    }
    ReferenceRenderer::~ReferenceRenderer(&refRenderer);
    rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
    rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&deviceProperties,
               "Primitive rendered, unique colors within expected bounds",
               (allocator<char> *)&renderState);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&deviceProperties);
  }
  std::__cxx11::string::~string((string *)&deviceProperties);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus RasterizationSamplesInstance::verifyImage (const tcu::ConstPixelBufferAccess& result)
{
	// Verify range of unique pixels
	{
		const deUint32	numUniqueColors = getUniqueColorsCount(result);
		const deUint32	minUniqueColors	= 3;

		tcu::TestLog& log = m_context.getTestContext().getLog();

		log << tcu::TestLog::Message
			<< "\nMin. unique colors expected: " << minUniqueColors << "\n"
			<< "Unique colors found: " << numUniqueColors << "\n"
			<< tcu::TestLog::EndMessage;

		if (numUniqueColors < minUniqueColors)
			return tcu::TestStatus::fail("Unique colors out of expected bounds");
	}

	// Verify shape of the rendered primitive (fuzzy-compare)
	{
		const tcu::TextureFormat	tcuColorFormat	= mapVkFormat(m_colorFormat);
		const tcu::TextureFormat	tcuDepthFormat	= tcu::TextureFormat();
		const ColorVertexShader		vertexShader;
		const ColorFragmentShader	fragmentShader	(tcuColorFormat, tcuDepthFormat);
		const rr::Program			program			(&vertexShader, &fragmentShader);
		ReferenceRenderer			refRenderer		(m_renderSize.x(), m_renderSize.y(), 1, tcuColorFormat, tcuDepthFormat, &program);
		rr::RenderState				renderState		(refRenderer.getViewportState());

		if (m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
		{
			VkPhysicalDeviceProperties deviceProperties;

			m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &deviceProperties);

			// gl_PointSize is clamped to pointSizeRange
			renderState.point.pointSize = deFloatMin(3.0f, deviceProperties.limits.pointSizeRange[1]);
		}

		if (m_modeFlags == 0)
		{
			refRenderer.colorClear(tcu::Vec4(0.0f));
			refRenderer.draw(renderState, mapVkPrimitiveTopology(m_primitiveTopology), m_vertices);
		}
		else
		{
			// For depth/stencil case the primitive is invisible and the surroundings are filled red.
			refRenderer.colorClear(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
			refRenderer.draw(renderState, mapVkPrimitiveTopology(m_primitiveTopology), m_vertices);
		}

		if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "FuzzyImageCompare", "Image comparison", refRenderer.getAccess(), result, 0.05f, tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Primitive has unexpected shape");
	}

	return tcu::TestStatus::pass("Primitive rendered, unique colors within expected bounds");
}